

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

Token * __thiscall inja::Lexer::scan_number(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  char ch;
  Lexer *this_local;
  
  while (uVar2 = this->pos,
        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in),
        uVar2 < sVar4) {
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&this->m_in,this->pos);
    cVar1 = *pvVar5;
    iVar3 = isdigit((int)cVar1);
    if ((((((iVar3 == 0) && (cVar1 != '.')) && (cVar1 != 'e')) && (cVar1 != 'E')) &&
        ((cVar1 != '+' ||
         (((this->pos != 0 &&
           (pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                               (&this->m_in,this->pos - 1), *pvVar5 != 'e')) &&
          (pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                              (&this->m_in,this->pos - 1), *pvVar5 != 'E')))))) &&
       ((cVar1 != '-' ||
        (((this->pos != 0 &&
          (pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                              (&this->m_in,this->pos - 1), *pvVar5 != 'e')) &&
         (pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&this->m_in,this->pos - 1), *pvVar5 != 'E')))))) break;
    this->pos = this->pos + 1;
  }
  make_token(__return_storage_ptr__,this,Number);
  return __return_storage_ptr__;
}

Assistant:

Token scan_number() {
    for (;;) {
      if (pos >= m_in.size()) {
        break;
      }
      const char ch = m_in[pos];
      // be very permissive in lexer (we'll catch errors when conversion happens)
      if (!(std::isdigit(ch) || ch == '.' || ch == 'e' || ch == 'E' || (ch == '+' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')) || (ch == '-' && (pos == 0 || m_in[pos-1] == 'e' || m_in[pos-1] == 'E')))) {
        break;
      }
      pos += 1;
    }
    return make_token(Token::Kind::Number);
  }